

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

void lexer_backtrace_prepare(void)

{
  long lVar1;
  
  bc = c;
  bl = l;
  bprev = prev;
  bline = line;
  bcolumn = column;
  lVar1 = ftell((FILE *)f);
  bseek = (uint)lVar1;
  return;
}

Assistant:

void lexer_backtrace_prepare()
{
    bc = c;
    bl = l;
    bprev = prev;
    bline = line;
    bcolumn = column;
    bseek = ftell(f);
}